

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sexp_conflict
sexp_readlink_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                  sexp_conflict arg1,sexp_conflict arg2)

{
  long lVar1;
  size_t __len;
  ssize_t sVar3;
  sexp_conflict psVar4;
  undefined8 uVar5;
  long lVar2;
  
  if ((((ulong)arg0 & 3) == 0) && (arg0->tag == 9)) {
    if ((((ulong)arg1 & 3) == 0) && (arg1->tag == 9)) {
      if (((ulong)arg2 & 1) == 0) {
        if ((((ulong)arg2 & 2) != 0) || (arg2->tag != 0xc)) {
          uVar5 = 2;
          goto LAB_001042d7;
        }
        lVar1 = (long)&((arg1->value).type.cpl)->tag + (long)&((arg1->value).type.name)->tag;
        lVar2 = (long)&((arg0->value).type.cpl)->tag + (long)&((arg0->value).type.name)->tag;
        __len = (long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length;
      }
      else {
        lVar2 = (long)&((arg0->value).type.cpl)->tag + (long)&((arg0->value).type.name)->tag;
        lVar1 = (long)&((arg1->value).type.cpl)->tag + (long)&((arg1->value).type.name)->tag;
        __len = (long)arg2 >> 1;
      }
      sVar3 = readlink((char *)(lVar2 + 0x10),(char *)(lVar1 + 0x10),__len);
      psVar4 = (sexp_conflict)sexp_make_integer(ctx,sVar3,sVar3 >> 0x3f);
      return psVar4;
    }
    uVar5 = 9;
    arg2 = arg1;
  }
  else {
    uVar5 = 9;
    arg2 = arg0;
  }
LAB_001042d7:
  psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,uVar5,arg2);
  return psVar4;
}

Assistant:

sexp sexp_readlink_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2) {
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_stringp(arg1))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  res = sexp_make_integer(ctx, readlink(sexp_string_data(arg0), sexp_string_data(arg1), sexp_sint_value(arg2)));
  return res;
}